

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::SPxMainSM<double>::DoubletonEquationPS::DoubletonEquationPS
          (DoubletonEquationPS *this,DoubletonEquationPS *old)

{
  double dVar1;
  int iVar2;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006ab348;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar2 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DoubletonEquationPS_006abac0;
  iVar2 = old->m_k;
  this->m_j = old->m_j;
  this->m_k = iVar2;
  this->m_i = old->m_i;
  this->m_maxSense = old->m_maxSense;
  this->m_jFixed = old->m_jFixed;
  dVar1 = old->m_kObj;
  this->m_jObj = old->m_jObj;
  this->m_kObj = dVar1;
  this->m_aij = old->m_aij;
  this->m_strictLo = old->m_strictLo;
  this->m_strictUp = old->m_strictUp;
  dVar1 = old->m_newUp;
  this->m_newLo = old->m_newLo;
  this->m_newUp = dVar1;
  dVar1 = old->m_oldUp;
  this->m_oldLo = old->m_oldLo;
  this->m_oldUp = dVar1;
  dVar1 = old->m_Up_j;
  this->m_Lo_j = old->m_Lo_j;
  this->m_Up_j = dVar1;
  dVar1 = old->m_rhs;
  this->m_lhs = old->m_lhs;
  this->m_rhs = dVar1;
  DSVectorBase<double>::DSVectorBase(&this->m_col,&old->m_col);
  return;
}

Assistant:

DoubletonEquationPS(const DoubletonEquationPS& old)
         : PostStep(old)
         , m_j(old.m_j)
         , m_k(old.m_k)
         , m_i(old.m_i)
         , m_maxSense(old.m_maxSense)
         , m_jFixed(old.m_jFixed)
         , m_jObj(old.m_jObj)
         , m_kObj(old.m_kObj)
         , m_aij(old.m_aij)
         , m_strictLo(old.m_strictLo)
         , m_strictUp(old.m_strictUp)
         , m_newLo(old.m_newLo)
         , m_newUp(old.m_newUp)
         , m_oldLo(old.m_oldLo)
         , m_oldUp(old.m_oldUp)
         , m_Lo_j(old.m_Lo_j)
         , m_Up_j(old.m_Up_j)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_col(old.m_col)
      {}